

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.h
# Opt level: O0

void __thiscall
CPubKey::
Set<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (CPubKey *this,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          pbegin,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 pend)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *__rhs;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *p_Var4;
  reference __src;
  void *in_RDI;
  long in_FS_OFFSET;
  int len;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint uVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = __gnu_cxx::
          operator==<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     in_stack_ffffffffffffffc0);
  if (bVar2) {
    uVar3 = 0;
  }
  else {
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator[]((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                 (difference_type)in_stack_ffffffffffffffc0);
    uVar3 = GetLen((uchar)((uint)in_stack_ffffffffffffffb8 >> 0x18));
  }
  if (uVar3 != 0) {
    __rhs = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             *)(long)(int)uVar3;
    uVar5 = uVar3;
    p_Var4 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)__gnu_cxx::operator-
                          ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)CONCAT44(uVar3,in_stack_ffffffffffffffc8),__rhs);
    if (__rhs == p_Var4) {
      __src = __gnu_cxx::
              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator[]((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)CONCAT44(uVar5,in_stack_ffffffffffffffc8),(difference_type)__rhs);
      memcpy(in_RDI,__src,(long)(int)uVar3);
      goto LAB_004da7f7;
    }
  }
  Invalidate((CPubKey *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
LAB_004da7f7:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Set(const T pbegin, const T pend)
    {
        int len = pend == pbegin ? 0 : GetLen(pbegin[0]);
        if (len && len == (pend - pbegin))
            memcpy(vch, (unsigned char*)&pbegin[0], len);
        else
            Invalidate();
    }